

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O1

Matrix3d *
opengv::relative_pose::modules::eigensolver::composeMwithJacobians
          (Matrix3d *__return_storage_ptr__,Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,
          Matrix3d *yzF,Matrix3d *zxF,cayley_t *cayley,Matrix3d *M_jac1,Matrix3d *M_jac2,
          Matrix3d *M_jac3)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  ActualDstType actualDst;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  double dVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  rotation_t R_jac3;
  rotation_t R_jac2;
  rotation_t R_jac1;
  double local_248;
  double dStack_240;
  double local_238;
  double local_230;
  double dStack_228;
  double local_220;
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_1d0;
  double dStack_1c8;
  double local_1c0;
  double dStack_1b8;
  double local_1a8;
  double dStack_1a0;
  
  math::cayley2rot_reduced(cayley);
  dVar2 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  dVar58 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
  dVar3 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  auVar183._0_8_ = dVar58 + dVar58;
  auVar183._8_8_ = dVar3 + dVar3;
  auVar160 = ZEXT816(0xc000000000000000);
  dVar58 = dVar58 * -2.0;
  dVar59 = dVar2 * -2.0;
  auVar63 = vshufpd_avx(auVar183,auVar183,1);
  auVar325._0_8_ = dVar2 * 2.0;
  auVar325._8_8_ = dVar3 * -2.0;
  dVar2 = (double)vmovlpd_avx(auVar325);
  auVar64 = vshufpd_avx(auVar325,auVar183,1);
  local_1a8 = auVar64._0_8_;
  dStack_1a0 = auVar64._8_8_;
  dVar3 = (double)vmovlpd_avx(auVar325);
  dVar4 = (double)vmovlpd_avx(auVar183);
  auVar65 = vshufpd_avx(auVar183,auVar325,1);
  dStack_1d0 = auVar63._0_8_;
  dStack_1c8 = auVar63._8_8_;
  local_1c0 = auVar65._0_8_;
  dStack_1b8 = auVar65._8_8_;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = local_238;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = local_220;
  dVar182 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  auVar371._8_8_ = 0;
  auVar371._0_8_ = dVar182;
  dVar5 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [1];
  auVar366._8_8_ = 0;
  auVar366._0_8_ = dVar5;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = local_208;
  dVar6 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  auVar369._8_8_ = 0;
  auVar369._0_8_ = dVar6;
  dVar7 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  auVar381._8_8_ = 0;
  auVar381._0_8_ = dVar7;
  auVar391._8_8_ = 0;
  auVar391._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar151 = vmulsd_avx512f(auVar167,auVar391);
  auVar395._8_8_ = 0;
  auVar395._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar152 = vmulsd_avx512f(auVar184,auVar395);
  auVar397._8_8_ = 0;
  auVar397._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar153 = vmulsd_avx512f(auVar162,auVar397);
  auVar399._8_8_ = 0;
  auVar399._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar154 = vmulsd_avx512f(auVar167,auVar399);
  auVar401._8_8_ = 0;
  auVar401._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar155 = vmulsd_avx512f(auVar184,auVar401);
  auVar245._8_8_ = 0;
  auVar245._0_8_ = local_238 * (dVar182 * local_238 + dVar5 * local_220 + dVar6 * local_208);
  auVar279._8_8_ = 0;
  auVar279._0_8_ =
       local_220 * (dVar7 * local_238 + auVar152._0_8_ + auVar151._0_8_) +
       local_208 * (auVar154._0_8_ + auVar155._0_8_ + auVar153._0_8_);
  auVar153 = vaddsd_avx512f(auVar245,auVar279);
  vmovsd_avx512f(auVar153);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[0];
  dVar5 = local_238 * -2.0;
  dVar6 = local_220 * -2.0;
  dVar7 = local_208 * -2.0;
  auVar151._8_8_ = 0;
  auVar151._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = dVar7;
  auVar151 = vmulsd_avx512f(auVar360,auVar151);
  auVar280._8_8_ = 0;
  auVar280._0_8_ =
       dVar6 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4];
  auVar151 = vaddsd_avx512f(auVar280,auVar151);
  auVar246._8_8_ = 0;
  auVar246._0_8_ =
       dVar5 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3];
  auVar151 = vaddsd_avx512f(auVar246,auVar151);
  vmovsd_avx512f(auVar151);
  auVar152._8_8_ = 0;
  auVar152._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar152 = vmulsd_avx512f(auVar360,auVar152);
  auVar281._8_8_ = 0;
  auVar281._0_8_ =
       dVar6 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7];
  auVar152 = vaddsd_avx512f(auVar281,auVar152);
  auVar247._8_8_ = 0;
  auVar247._0_8_ =
       dVar5 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6];
  auVar152 = vaddsd_avx512f(auVar247,auVar152);
  vmovsd_avx512f(auVar152);
  auVar248._8_8_ = 0;
  auVar248._0_8_ = dStack_240;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = dStack_228;
  auVar308._8_8_ = 0;
  auVar308._0_8_ =
       dVar5 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0] +
       dVar6 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
       dVar7 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2];
  auVar154 = vmulsd_avx512f(auVar308,auVar248);
  auVar151 = vmulsd_avx512f(auVar151,auVar282);
  auVar309._8_8_ = 0;
  auVar309._0_8_ = dStack_210;
  auVar152 = vmulsd_avx512f(auVar152,auVar309);
  auVar151 = vaddsd_avx512f(auVar151,auVar152);
  auVar151 = vaddsd_avx512f(auVar154,auVar151);
  auVar151 = vaddsd_avx512f(auVar153,auVar151);
  vmovsd_avx512f(auVar151);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[0];
  auVar153._8_8_ = 0;
  auVar153._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar152 = vmulsd_avx512f(auVar248,auVar153);
  auVar154._8_8_ = 0;
  auVar154._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar153 = vmulsd_avx512f(auVar282,auVar154);
  auVar155._8_8_ = 0;
  auVar155._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar154 = vmulsd_avx512f(auVar309,auVar155);
  auVar153 = vaddsd_avx512f(auVar153,auVar154);
  auVar152 = vaddsd_avx512f(auVar152,auVar153);
  vmovsd_avx512f(auVar152);
  auVar156._8_8_ = 0;
  auVar156._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar153 = vmulsd_avx512f(auVar248,auVar156);
  auVar157._8_8_ = 0;
  auVar157._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar154 = vmulsd_avx512f(auVar282,auVar157);
  auVar158._8_8_ = 0;
  auVar158._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar155 = vmulsd_avx512f(auVar309,auVar158);
  auVar154 = vaddsd_avx512f(auVar154,auVar155);
  auVar153 = vaddsd_avx512f(auVar153,auVar154);
  vmovsd_avx512f(auVar153);
  auVar159._8_8_ = 0;
  auVar159._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar154 = vmulsd_avx512f(auVar248,auVar159);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7];
  auVar155 = vmulsd_avx512f(auVar282,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8];
  auVar156 = vmulsd_avx512f(auVar309,auVar9);
  auVar155 = vaddsd_avx512f(auVar155,auVar156);
  auVar154 = vaddsd_avx512f(auVar154,auVar155);
  auVar152 = vmulsd_avx512f(auVar248,auVar152);
  auVar153 = vmulsd_avx512f(auVar282,auVar153);
  auVar154 = vmulsd_avx512f(auVar309,auVar154);
  auVar153 = vaddsd_avx512f(auVar153,auVar154);
  auVar152 = vaddsd_avx512f(auVar152,auVar153);
  auVar151 = vaddsd_avx512f(auVar151,auVar152);
  vmovsd_avx512f(auVar151);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[0];
  auVar151 = vaddsd_avx512f(auVar325,auVar325);
  auVar152 = vmulsd_avx512f(auVar151,auVar371);
  auVar153 = vaddsd_avx512f(ZEXT816(0x4000000000000000),ZEXT816(0x4000000000000000));
  auVar154 = vmulsd_avx512f(auVar366,auVar153);
  auVar404._8_8_ = 0;
  auVar404._0_8_ = dVar58;
  auVar155 = vaddsd_avx512f(auVar404,auVar404);
  auVar156 = vmulsd_avx512f(auVar369,auVar155);
  auVar157 = vmulsd_avx512f(auVar151,auVar381);
  auVar158 = vmulsd_avx512f(auVar391,auVar153);
  auVar159 = vmulsd_avx512f(auVar395,auVar155);
  auVar151 = vmulsd_avx512f(auVar151,auVar397);
  auVar153 = vmulsd_avx512f(auVar399,auVar153);
  auVar155 = vmulsd_avx512f(auVar401,auVar155);
  auVar153 = vaddsd_avx512f(auVar153,auVar155);
  dVar182 = (auVar152._0_8_ + auVar154._0_8_ + auVar156._0_8_) * local_238 +
            (auVar157._0_8_ + auVar158._0_8_ + auVar159._0_8_) * local_220 +
            (auVar151._0_8_ + auVar153._0_8_) * local_208;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar182;
  dVar60 = auVar325._0_8_ * -2.0;
  auVar151 = vmulsd_avx512f(ZEXT816(0x4000000000000000),auVar160);
  auVar405._8_8_ = 0;
  auVar405._0_8_ = dVar58;
  auVar152 = vmulsd_avx512f(auVar405,auVar160);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar153 = vmulsd_avx512f(auVar152,auVar10);
  auVar382._8_8_ = 0;
  auVar382._0_8_ =
       auVar151._0_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar153 = vaddsd_avx512f(auVar382,auVar153);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar154 = vmulsd_avx512f(auVar151,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar155 = vmulsd_avx512f(auVar152,auVar12);
  auVar154 = vaddsd_avx512f(auVar154,auVar155);
  auVar383._8_8_ = 0;
  auVar383._0_8_ =
       dVar60 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3];
  auVar154 = vaddsd_avx512f(auVar383,auVar154);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar152 = vmulsd_avx512f(auVar152,auVar13);
  auVar372._8_8_ = 0;
  auVar372._0_8_ =
       auVar151._0_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar151 = vaddsd_avx512f(auVar372,auVar152);
  dVar182 = dVar182 + (dVar60 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[0] + auVar153._0_8_) * dStack_240 +
                      auVar154._0_8_ * dStack_228 +
                      (dVar60 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6] + auVar151._0_8_) * dStack_210;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar182;
  dVar182 = dVar182 + (dVar5 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[0] +
                      dVar6 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[1] +
                      dVar7 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[2]) * dStack_1d0 +
                      (dVar5 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[3] +
                      dVar6 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[4] +
                      dVar7 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[5]) * dVar58 +
                      (dVar5 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[6] +
                      dVar6 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[7] +
                      dVar7 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[8]) * -2.0;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar182;
  dVar5 = dVar58 + dVar58;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar182 + ((auVar183._8_8_ + auVar183._8_8_) *
                  (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[3] +
                 dVar5 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4] +
                 (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5] * -4.0) * dStack_228 +
                 ((auVar183._8_8_ + auVar183._8_8_) *
                  (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] +
                 dVar5 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[7] +
                 (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8] * -4.0) * dStack_210 +
                 dStack_240 *
                 (dVar5 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[1] +
                  (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2] * -4.0 +
                 (dStack_1d0 + dStack_1d0) *
                 (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]);
  dVar182 = dVar3 + dVar3;
  dVar5 = auVar325._8_8_ + auVar325._8_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = dVar5;
  auVar151 = vmulsd_avx512f(auVar370,auVar14);
  auVar384._8_8_ = 0;
  auVar384._0_8_ =
       dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4];
  auVar151 = vaddsd_avx512f(auVar384,auVar151);
  dVar182 = local_238 *
            (dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1] +
             dVar5 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[2] +
            (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0] * -4.0) +
            ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3] * -4.0 + auVar151._0_8_) * local_220 +
            ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6] * -4.0 +
            dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
            dVar5 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8]) * local_208;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar182;
  dVar5 = dVar3 * -2.0;
  dVar6 = auVar325._8_8_ * -2.0;
  dVar182 = dVar182 + dStack_240 *
                      (dVar5 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[1] +
                       dVar6 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[2] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0] * 4.0) +
                      ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3] * 4.0 +
                      dVar5 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[4] +
                      dVar6 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[5]) * dStack_228 +
                      dStack_210 *
                      ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] * 4.0 +
                      dVar6 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[8] +
                      dVar5 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[7]);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar182;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = local_238;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = local_220;
  dVar60 = local_238 * -2.0;
  dVar61 = local_220 * -2.0;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = local_208;
  dVar62 = local_208 * -2.0;
  dVar182 = dVar182 + dStack_1a0 *
                      (dVar60 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[0] +
                      dVar62 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[2] +
                      dVar61 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[1]) +
                      (dVar60 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6] +
                      dVar61 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7] +
                      dVar62 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[8]) * auVar325._0_8_ +
                      auVar183._8_8_ *
                      (dVar61 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                       dVar62 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5] +
                      dVar60 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[3]);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar182;
  dVar5 = dStack_1a0 + dStack_1a0;
  dVar6 = auVar183._8_8_ + auVar183._8_8_;
  dVar7 = auVar325._0_8_ + auVar325._0_8_;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = dStack_240;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = dStack_228;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = dStack_210;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar182 + (dVar6 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[1] +
                  dVar7 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[2] +
                 dVar5 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[0]) * dStack_240 +
                 (dVar6 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[4] +
                  dVar7 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[5] +
                 dVar5 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]) * dStack_228 +
                 (dVar5 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[6] +
                 dVar6 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[7] +
                 dVar7 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8]) * dStack_210;
  dVar182 = dVar4 + dVar4;
  dVar5 = dStack_1d0 + dStack_1d0;
  auVar392._8_8_ = 0;
  auVar392._0_8_ = dStack_1b8;
  auVar151 = vaddsd_avx512f(auVar392,auVar392);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar152 = vmulsd_avx512f(auVar151,auVar15);
  auVar385._8_8_ = 0;
  auVar385._0_8_ =
       dVar5 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1];
  auVar152 = vaddsd_avx512f(auVar385,auVar152);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = dVar5;
  auVar153 = vmulsd_avx512f(auVar373,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar154 = vmulsd_avx512f(auVar151,auVar17);
  auVar153 = vaddsd_avx512f(auVar153,auVar154);
  auVar386._8_8_ = 0;
  auVar386._0_8_ =
       dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3];
  auVar153 = vaddsd_avx512f(auVar386,auVar153);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar151 = vmulsd_avx512f(auVar151,auVar18);
  auVar374._8_8_ = 0;
  auVar374._0_8_ =
       dVar5 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7];
  auVar151 = vaddsd_avx512f(auVar374,auVar151);
  dVar182 = (dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] + auVar152._0_8_) * local_238 +
            auVar153._0_8_ * local_220 +
            (dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] + auVar151._0_8_) * local_208;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar182;
  dVar5 = dVar4 * -2.0;
  dVar6 = dStack_1d0 * -2.0;
  auVar393._8_8_ = 0;
  auVar393._0_8_ = dStack_1b8;
  auVar151 = vmulsd_avx512f(auVar393,auVar160);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar152 = vmulsd_avx512f(auVar151,auVar19);
  auVar375._8_8_ = 0;
  auVar375._0_8_ =
       dVar6 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1];
  auVar152 = vaddsd_avx512f(auVar375,auVar152);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = dVar6;
  auVar153 = vmulsd_avx512f(auVar361,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar154 = vmulsd_avx512f(auVar151,auVar21);
  auVar153 = vaddsd_avx512f(auVar153,auVar154);
  auVar376._8_8_ = 0;
  auVar376._0_8_ =
       dVar5 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3];
  auVar153 = vaddsd_avx512f(auVar376,auVar153);
  dVar182 = dVar182 + (dVar5 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[0] + auVar152._0_8_) * dStack_240 +
                      auVar153._0_8_ * dStack_228 +
                      (dVar5 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[6] +
                      dVar6 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[7] +
                      auVar151._0_8_ *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) * dStack_210;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar182;
  dVar182 = dVar182 + (dVar60 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[0] +
                      dVar61 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[1] +
                      dVar62 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[2]) * 2.0 +
                      (dVar60 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3] +
                      dVar61 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[4] +
                      dVar62 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[5]) * dVar59 +
                      local_1c0 *
                      (dVar61 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                       dVar62 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8] +
                      dVar60 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[6]);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar182;
  dVar5 = dVar59 + dVar59;
  dVar6 = local_1c0 + local_1c0;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * 4.0 +
       dVar5 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
       dVar6 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) * dStack_240 +
       ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] * 4.0 +
       dVar5 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
       dVar6 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5]) * dStack_228 +
       ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] * 4.0 +
       dVar5 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
       dVar6 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) * dStack_210 + dVar182;
  dVar182 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  auVar362._8_8_ = 0;
  auVar362._0_8_ = dVar182;
  dVar5 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [1];
  auVar367._8_8_ = 0;
  auVar367._0_8_ = dVar5;
  dVar6 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  dVar7 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  auVar377._8_8_ = 0;
  auVar377._0_8_ = dVar7;
  dVar60 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[4];
  auVar387._8_8_ = 0;
  auVar387._0_8_ = dVar60;
  auVar394._8_8_ = 0;
  auVar394._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar151 = vmulsd_avx512f(auVar221,auVar394);
  auVar396._8_8_ = 0;
  auVar396._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar152 = vmulsd_avx512f(auVar163,auVar396);
  auVar398._8_8_ = 0;
  auVar398._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar153 = vmulsd_avx512f(auVar185,auVar398);
  auVar400._8_8_ = 0;
  auVar400._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar154 = vmulsd_avx512f(auVar221,auVar400);
  auVar153 = vaddsd_avx512f(auVar153,auVar154);
  auVar152 = vaddsd_avx512f(auVar152,auVar153);
  vmovsd_avx512f(auVar152);
  auVar326._8_8_ = 0;
  auVar326._0_8_ = local_248;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = local_230;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = dVar7 * local_238 + dVar60 * local_220 + auVar151._0_8_;
  auVar151 = vmulsd_avx512f(auVar357,auVar340);
  auVar358._8_8_ = 0;
  auVar358._0_8_ = local_218;
  auVar152 = vmulsd_avx512f(auVar152,auVar358);
  auVar151 = vaddsd_avx512f(auVar151,auVar152);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = local_248 * (dVar5 * local_220 + dVar6 * local_208 + dVar182 * local_238);
  auVar151 = vaddsd_avx512f(auVar168,auVar151);
  pdVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array + 3;
  vmovsd_avx512f(auVar151);
  *pdVar1 = *pdVar1;
  auVar169._8_8_ = 0x8000000000000000;
  auVar169._0_8_ = 0x8000000000000000;
  auVar152 = vxorpd_avx512vl(auVar221,auVar169);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar153 = vmulsd_avx512f(auVar152,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar154 = vmulsd_avx512f(auVar185,auVar23);
  auVar153 = vsubsd_avx512f(auVar153,auVar154);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar154 = vmulsd_avx512f(auVar163,auVar24);
  auVar153 = vsubsd_avx512f(auVar153,auVar154);
  vmovsd_avx512f(auVar153);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar154 = vmulsd_avx512f(auVar152,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar155 = vmulsd_avx512f(auVar185,auVar26);
  auVar154 = vsubsd_avx512f(auVar154,auVar155);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar155 = vmulsd_avx512f(auVar163,auVar27);
  auVar154 = vsubsd_avx512f(auVar154,auVar155);
  vmovsd_avx512f(auVar154);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar152 = vmulsd_avx512f(auVar152,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar155 = vmulsd_avx512f(auVar185,auVar29);
  auVar152 = vsubsd_avx512f(auVar152,auVar155);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar155 = vmulsd_avx512f(auVar163,auVar30);
  auVar152 = vsubsd_avx512f(auVar152,auVar155);
  auVar153 = vmulsd_avx512f(auVar163,auVar153);
  auVar154 = vmulsd_avx512f(auVar185,auVar154);
  auVar152 = vmulsd_avx512f(auVar221,auVar152);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = auVar153._0_8_ + auVar154._0_8_ + auVar152._0_8_;
  auVar151 = vaddsd_avx512f(auVar151,auVar164);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = auVar151._0_8_;
  auVar186._0_8_ = -dStack_210;
  auVar186._8_8_ = 0x8000000000000000;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar152 = vmulsd_avx512f(auVar283,auVar31);
  auVar222._8_8_ = 0;
  auVar222._0_8_ =
       auVar186._0_8_ *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar152 = vsubsd_avx512f(auVar222,auVar152);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar153 = vmulsd_avx512f(auVar249,auVar32);
  auVar152 = vsubsd_avx512f(auVar152,auVar153);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar153 = vmulsd_avx512f(auVar186,auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar154 = vmulsd_avx512f(auVar283,auVar34);
  auVar153 = vsubsd_avx512f(auVar153,auVar154);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar154 = vmulsd_avx512f(auVar249,auVar35);
  auVar153 = vsubsd_avx512f(auVar153,auVar154);
  vmovsd_avx512f(auVar153);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar154 = vmulsd_avx512f(auVar283,auVar36);
  auVar187._8_8_ = 0;
  auVar187._0_8_ =
       auVar186._0_8_ *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar154 = vsubsd_avx512f(auVar187,auVar154);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar155 = vmulsd_avx512f(auVar249,auVar37);
  auVar154 = vsubsd_avx512f(auVar154,auVar155);
  auVar153 = vmulsd_avx512f(auVar340,auVar153);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = local_218 * auVar154._0_8_;
  auVar153 = vaddsd_avx512f(auVar153,auVar188);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = local_248 * auVar152._0_8_ + auVar153._0_8_;
  auVar151 = vaddsd_avx512f(auVar151,auVar189);
  pdVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array + 3;
  vmovsd_avx512f(auVar151);
  *pdVar1 = *pdVar1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar152 = vmulsd_avx512f(auVar310,auVar38);
  auVar190._8_8_ = 0;
  auVar190._0_8_ =
       dStack_228 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar152 = vaddsd_avx512f(auVar190,auVar152);
  auVar165._8_8_ = 0;
  auVar165._0_8_ =
       dStack_240 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar152 = vaddsd_avx512f(auVar165,auVar152);
  vmovsd_avx512f(auVar152);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = local_220;
  auVar152 = vmulsd_avx512f(auVar152,auVar191);
  auVar250._8_8_ = 0;
  auVar250._0_8_ =
       (dStack_240 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + dStack_228 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              dStack_210 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * local_238 +
       auVar152._0_8_ +
       (dStack_240 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + dStack_228 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              dStack_210 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_208;
  auVar151 = vaddsd_avx512f(auVar151,auVar250);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = auVar151._0_8_;
  auVar402._8_8_ = 0;
  auVar402._0_8_ = auVar325._0_8_;
  auVar151 = vmulsd_avx512f(auVar362,auVar402);
  auVar152 = vmulsd_avx512f(auVar367,ZEXT816(0x4000000000000000));
  auVar363._8_8_ = 0;
  auVar363._0_8_ = dVar58;
  auVar153 = vmulsd_avx512f(auVar377,auVar402);
  auVar154 = vmulsd_avx512f(auVar387,ZEXT816(0x4000000000000000));
  auVar155 = vmulsd_avx512f(auVar394,auVar363);
  auVar403._8_8_ = 0;
  auVar403._0_8_ = auVar325._0_8_;
  auVar156 = vmulsd_avx512f(auVar396,auVar403);
  auVar157 = vmulsd_avx512f(auVar398,ZEXT816(0x4000000000000000));
  auVar158 = vmulsd_avx512f(auVar400,auVar363);
  dVar182 = local_248 * (auVar151._0_8_ + auVar152._0_8_ + dVar6 * dVar58) +
            local_230 * (auVar153._0_8_ + auVar155._0_8_ + auVar154._0_8_) +
            local_218 * (auVar157._0_8_ + auVar158._0_8_ + auVar156._0_8_);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar182;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = auVar183._8_8_;
  dVar182 = dVar182 + (local_238 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      local_220 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] +
                      local_208 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2]) * auVar183._0_8_ +
                      (local_238 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3] +
                      local_208 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5] +
                      local_220 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4]) * auVar183._8_8_ +
                      (local_238 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      local_208 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] +
                      local_220 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7]) * dVar2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar182;
  auVar151 = vmulsd_avx512f(auVar403,auVar160);
  auVar152 = vmulsd_avx512f(ZEXT816(0x4000000000000000),auVar160);
  auVar160._8_8_ = 0;
  auVar160._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar153 = vmulsd_avx512f(auVar152,auVar160);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = dVar58 * -2.0;
  auVar154 = vmulsd_avx512f(auVar364,auVar39);
  auVar153 = vaddsd_avx512f(auVar153,auVar154);
  auVar378._8_8_ = 0;
  auVar378._0_8_ =
       auVar151._0_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar153 = vaddsd_avx512f(auVar378,auVar153);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar154 = vmulsd_avx512f(auVar151,auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar155 = vmulsd_avx512f(auVar152,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar156 = vmulsd_avx512f(auVar364,auVar42);
  auVar155 = vaddsd_avx512f(auVar155,auVar156);
  auVar154 = vaddsd_avx512f(auVar154,auVar155);
  vmovsd_avx512f(auVar154);
  auVar154 = vmulsd_avx512f(auVar191,auVar154);
  dVar182 = dVar182 + auVar153._0_8_ * local_238 +
                      auVar154._0_8_ +
                      (auVar151._0_8_ *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      auVar152._0_8_ *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
                      dVar58 * -2.0 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) * local_208;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar182;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = auVar183._8_8_;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = dVar58;
  auVar388._8_8_ = 0x8000000000000000;
  auVar388._0_8_ = 0x4000000000000000;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar151 = vmulsd_avx512f(auVar388,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar152 = vmulsd_avx512f(auVar368,auVar44);
  auVar151 = vsubsd_avx512f(auVar151,auVar152);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar152 = vmulsd_avx512f(auVar365,auVar45);
  auVar151 = vsubsd_avx512f(auVar151,auVar152);
  vmovsd_avx512f(auVar151);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar152 = vmulsd_avx512f(auVar388,auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar153 = vmulsd_avx512f(auVar368,auVar47);
  auVar152 = vsubsd_avx512f(auVar152,auVar153);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar153 = vmulsd_avx512f(auVar365,auVar48);
  auVar152 = vsubsd_avx512f(auVar152,auVar153);
  vmovsd_avx512f(auVar152);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar153 = vmulsd_avx512f(auVar368,auVar49);
  auVar389._8_8_ = 0;
  auVar389._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       * 2.0;
  auVar153 = vsubsd_avx512f(auVar389,auVar153);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar154 = vmulsd_avx512f(auVar365,auVar50);
  auVar153 = vsubsd_avx512f(auVar153,auVar154);
  auVar151 = vmulsd_avx512f(auVar326,auVar151);
  auVar152 = vmulsd_avx512f(auVar340,auVar152);
  dVar182 = dVar182 + auVar151._0_8_ + auVar152._0_8_ + local_218 * auVar153._0_8_;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar182;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = dStack_240;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = dStack_228;
  auVar379._0_8_ = -dStack_210;
  auVar379._8_8_ = 0x8000000000000000;
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar151 = vmulsd_avx512f(auVar359,auVar51);
  auVar390._8_8_ = 0;
  auVar390._0_8_ =
       auVar379._0_8_ *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar151 = vsubsd_avx512f(auVar390,auVar151);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar152 = vmulsd_avx512f(auVar341,auVar52);
  auVar151 = vsubsd_avx512f(auVar151,auVar152);
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar152 = vmulsd_avx512f(auVar379,auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar153 = vmulsd_avx512f(auVar359,auVar54);
  auVar152 = vsubsd_avx512f(auVar152,auVar153);
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar153 = vmulsd_avx512f(auVar341,auVar55);
  auVar152 = vsubsd_avx512f(auVar152,auVar153);
  vmovsd_avx512f(auVar152);
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar153 = vmulsd_avx512f(auVar359,auVar56);
  auVar380._8_8_ = 0;
  auVar380._0_8_ =
       auVar379._0_8_ *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar153 = vsubsd_avx512f(auVar380,auVar153);
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar154 = vmulsd_avx512f(auVar341,auVar57);
  auVar153 = vsubsd_avx512f(auVar153,auVar154);
  auVar152 = vmulsd_avx512f(auVar284,auVar152);
  dVar182 = dVar182 + auVar151._0_8_ * auVar183._0_8_ + auVar152._0_8_ + auVar153._0_8_ * dVar2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar182;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar182 + local_238 *
                 (auVar183._8_8_ *
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2] * -2.0 +
                 dVar58 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[1]) +
                 local_220 *
                 (dVar58 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[4] +
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] * -2.0 +
                 auVar183._8_8_ *
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3]) +
                 (auVar183._8_8_ *
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] +
                 dVar58 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[7] +
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8] * -2.0) * local_208;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       (dStack_240 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + dStack_228 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              dStack_210 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * auVar325._0_8_ +
       (dStack_240 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + dStack_210 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
              dStack_228 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) * 2.0 +
       (dStack_240 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + dStack_228 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              dStack_210 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * dVar58 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * -2.0 +
       dVar3 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
       auVar325._8_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       ) * local_248 +
       ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] * -2.0 +
       auVar325._8_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
       + dVar3 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4]) * local_230 +
       ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] * -2.0 +
       dVar3 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
       auVar325._8_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       ) * local_218;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       (local_238 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_220 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_208 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * local_1a8 +
       (local_238 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_208 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
              local_220 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) * auVar183._0_8_ +
       (local_238 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_220 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_208 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * 2.0 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  auVar110._8_8_ = auVar183._0_8_;
  auVar110._0_8_ = 0xc000000000000000;
  auVar119._8_8_ = 0x4000000000000000;
  auVar119._0_8_ = dVar3;
  auVar152 = vunpcklpd_avx(auVar110,ZEXT816(0xc000000000000000));
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar223._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar223._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = dVar3;
  auVar152 = vunpcklpd_avx(auVar119,auVar327);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar192._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar192._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  dVar182 = auVar325._8_8_ + auVar325._8_8_;
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar285._0_8_ = dVar182 * auVar151._0_8_;
  auVar285._8_8_ = dVar182 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar192,auVar285);
  auVar152 = vsubpd_avx(auVar151,auVar223);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       auVar152._0_8_ * local_238 +
       auVar151._0_8_ * local_220 +
       ((dVar3 * -2.0 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - dVar182 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8]) -
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       * -4.0) * local_208 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  dVar182 = -auVar325._0_8_;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       ((dVar182 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        auVar183._8_8_ *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - dStack_1a0 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * local_248 +
       ((dVar182 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        auVar183._8_8_ *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - dStack_1a0 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * local_230 +
       ((dVar182 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        auVar183._8_8_ *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - dStack_1a0 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * local_218 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  dVar182 = -dStack_210;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       ((dVar182 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        dStack_228 *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - dStack_240 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * local_1a8 +
       ((dVar182 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        dStack_228 *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - dStack_240 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * auVar183._0_8_ +
       ((dVar182 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        dStack_228 *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - dStack_240 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * 2.0 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       (dStack_1a0 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + auVar325._0_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              auVar183._8_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * local_238 +
       (auVar183._8_8_ *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + auVar325._0_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       dStack_1a0 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * local_220 +
       (dStack_1a0 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + auVar183._8_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              auVar325._0_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_208 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       (dStack_240 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + dStack_210 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              dStack_228 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * -2.0 +
       (dStack_228 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + dStack_210 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       dStack_240 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * dVar3 +
       (dStack_240 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + dStack_228 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              dStack_210 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * auVar325._8_8_ +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       (dVar4 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0] +
       dStack_1b8 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       + dStack_1d0 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1]) * local_248 +
       (dStack_1d0 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + dStack_1b8 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       dVar4 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * local_230 +
       (dVar4 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6] +
       dStack_1d0 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       + dStack_1b8 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [8]) * local_218;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       (local_238 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_208 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_220 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * dVar59 +
       (local_220 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_208 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_238 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * -2.0 +
       (local_238 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_220 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_208 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * dStack_1c8 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  auVar94._8_8_ = 0xc000000000000000;
  auVar94._0_8_ = dVar4;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = dVar4;
  auVar152 = vunpcklpd_avx(auVar94,auVar328);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar193._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar193._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = dStack_1d0;
  auVar152 = vunpcklpd_avx(auVar63,auVar251);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar224._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar224._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  dVar182 = dStack_1b8 + dStack_1b8;
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar311._0_8_ = dVar182 * auVar151._0_8_;
  auVar311._8_8_ = dVar182 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar224,auVar311);
  auVar152 = vsubpd_avx(auVar151,auVar193);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       auVar152._0_8_ * local_238 +
       auVar151._0_8_ * local_220 +
       ((dStack_1d0 * -2.0 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - dVar182 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8]) -
       (dVar4 + dVar4) *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * local_208 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  dVar182 = -local_1c0;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       ((dVar182 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        dVar59 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1]) -
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       * 2.0) * local_248 +
       ((dVar182 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        dVar59 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4]) -
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       * 2.0) * local_230 +
       ((dVar182 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        dVar59 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7]) -
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       * 2.0) * local_218 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  dVar182 = -dStack_210;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       ((dVar182 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        dStack_228 *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - dStack_240 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * dVar59 +
       ((dVar182 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        dStack_228 *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - dStack_240 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * -2.0 +
       ((dVar182 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        dStack_228 *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - dStack_240 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * dStack_1c8 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * 2.0 +
       local_1c0 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       + dVar59 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[1]) * local_238 +
       (dVar59 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] +
        local_1c0 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [5] + (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] * 2.0) * local_220 +
       ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] * 2.0 +
       dVar59 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[7] +
       local_1c0 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       ) * local_208 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       (dStack_240 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + dStack_210 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              dStack_228 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * dVar4 +
       (dStack_228 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + dStack_210 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       dStack_240 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * dStack_1d0 +
       (dStack_240 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + dStack_228 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              dStack_210 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * dStack_1b8 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] =
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * dStack_240 +
       (local_220 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_238 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * dStack_228 +
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * dStack_210;
  dVar182 = -local_208;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] =
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_220 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_238 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * local_248 +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        local_220 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - local_238 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * local_230 +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        local_220 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - local_238 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * local_218 +
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[6];
  dVar182 = -dStack_210;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] =
       ((dVar182 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        dStack_228 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - dStack_240 *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * dStack_240 +
       ((dVar182 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        dStack_228 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - dStack_240 *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * dStack_228 +
       ((dVar182 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        dStack_228 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - dStack_240 *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * dStack_210 +
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[6];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] =
       (dStack_240 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + dStack_210 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              dStack_228 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * local_248 +
       (dStack_228 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + dStack_210 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       dStack_240 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * local_230 +
       (dStack_240 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + dStack_228 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              dStack_210 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_218 +
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[6];
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       (auVar325._0_8_ *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + dVar58 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[2] +
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] * 2.0) * dStack_240 +
       ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] * 2.0 +
        dVar58 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5] +
       auVar325._0_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * dStack_228 +
       (auVar325._0_8_ *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] * 2.0 +
              dVar58 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[8]) * dStack_210;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * auVar183._8_8_ +
       (local_220 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_238 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * dVar58 +
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * -2.0 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  dVar182 = -dVar58;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1] * 2.0) -
       auVar325._0_8_ *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       ) * local_248 +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] * 2.0) -
       auVar325._0_8_ *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * local_230 +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7] * 2.0) -
       auVar325._0_8_ *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * local_218 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  dVar182 = -local_208;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_220 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_238 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * auVar183._0_8_ +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        local_220 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - local_238 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * auVar183._8_8_ +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        local_220 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - local_238 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * dVar2 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  auVar133._8_8_ = auVar325._0_8_;
  auVar133._0_8_ = auVar183._8_8_;
  auVar141._8_8_ = 0x4000000000000000;
  auVar141._0_8_ = dVar58;
  auVar149._8_8_ = dVar58;
  auVar149._0_8_ = 0xc000000000000000;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = auVar183._8_8_;
  auVar152 = vunpcklpd_avx(auVar133,auVar342);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar194._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar194._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = dVar58;
  auVar152 = vunpcklpd_avx(auVar141,auVar286);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar225._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar225._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar152 = vunpcklpd_avx(auVar149,ZEXT816(0xc000000000000000));
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar252._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar252._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar225,auVar252);
  auVar152 = vsubpd_avx(auVar151,auVar194);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       auVar152._0_8_ * dStack_240 +
       auVar151._0_8_ * dStack_228 +
       ((dVar58 * -2.0 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8] * -4.0) -
       (auVar183._8_8_ + auVar183._8_8_) *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * dStack_210 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       (auVar183._8_8_ *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] * -2.0 +
              dVar58 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1]) * local_248 +
       (dVar58 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] +
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [5] * -2.0 +
       auVar183._8_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * local_230 +
       (auVar183._8_8_ *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + dVar58 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] +
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8] * -2.0) * local_218 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       (dStack_240 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + dStack_210 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              dStack_228 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * auVar183._0_8_ +
       (dStack_228 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + dStack_210 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       dStack_240 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * auVar183._8_8_ +
       (dStack_240 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + dStack_228 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              dStack_210 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * dVar2 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * -2.0 +
       auVar325._8_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       + dVar3 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1]) * dStack_240 +
       (dVar3 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[4] +
        auVar325._8_8_ *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [5] + (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] * -2.0) * dStack_228 +
       ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] * -2.0 +
       dVar3 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
       auVar325._8_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       ) * dStack_210;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * dStack_1a0 +
       (local_220 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_238 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * auVar183._8_8_ +
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * auVar325._0_8_ +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  dVar182 = -auVar325._8_8_;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        dVar3 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[1]) -
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       * -2.0) * local_248 +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        dVar3 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[4]) -
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       * -2.0) * local_230 +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        dVar3 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[7]) -
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       * -2.0) * local_218 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  dVar182 = -local_208;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_220 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_238 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * local_1a8 +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        local_220 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - local_238 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * auVar183._0_8_ +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        local_220 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - local_238 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * 2.0 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  auVar108._8_8_ = 0xc000000000000000;
  auVar108._0_8_ = dStack_1a0;
  auVar117._8_8_ = dVar3;
  auVar117._0_8_ = auVar183._8_8_;
  auVar126._8_8_ = auVar325._8_8_;
  auVar126._0_8_ = auVar325._0_8_;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = dStack_1a0;
  auVar152 = vunpcklpd_avx(auVar108,auVar343);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar195._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar195._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = auVar183._8_8_;
  auVar152 = vunpcklpd_avx(auVar117,auVar287);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar226._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar226._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = auVar325._0_8_;
  auVar152 = vunpcklpd_avx(auVar126,auVar312);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar253._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar253._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar226,auVar253);
  auVar152 = vsubpd_avx(auVar151,auVar195);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       auVar152._0_8_ * dStack_240 +
       auVar151._0_8_ * dStack_228 +
       ((auVar183._8_8_ * -2.0 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (auVar325._0_8_ + auVar325._0_8_) *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (dStack_1a0 + dStack_1a0) *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * dStack_210 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       (dStack_1a0 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + auVar325._0_8_ *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              auVar183._8_8_ *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * local_248 +
       (auVar183._8_8_ *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + auVar325._0_8_ *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       dStack_1a0 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * local_230 +
       (dStack_1a0 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + auVar183._8_8_ *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              auVar325._0_8_ *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_218 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       (dStack_240 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + dStack_210 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              dStack_228 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * local_1a8 +
       (dStack_228 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + dStack_210 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       dStack_240 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * auVar183._0_8_ +
       (dStack_240 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + dStack_228 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              dStack_210 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * 2.0 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       (dVar4 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0] +
       dStack_1b8 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       + dStack_1d0 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1]) * dStack_240 +
       (dStack_1d0 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + dStack_1b8 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       dVar4 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * dStack_228 +
       (dVar4 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6] +
       dStack_1d0 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       + dStack_1b8 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [8]) * dStack_210;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * 2.0 +
       (local_220 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_238 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * dVar59 +
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_1c0 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  dVar182 = -dStack_1b8;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        dStack_1d0 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - dVar4 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0]) * local_248 +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        dStack_1d0 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - dVar4 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) * local_230 +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        dStack_1d0 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - dVar4 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) * local_218 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  dVar182 = -local_208;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_220 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_238 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * dVar59 +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        local_220 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - local_238 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * -2.0 +
       ((dVar182 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        local_220 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - local_238 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * dStack_1c8 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  auVar92._8_8_ = dVar4;
  auVar92._0_8_ = 0x4000000000000000;
  auVar101._8_8_ = dStack_1d0;
  auVar101._0_8_ = dVar59;
  auVar152 = vunpcklpd_avx(auVar92,ZEXT816(0x4000000000000000));
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar196._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar196._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = dVar59;
  auVar152 = vunpcklpd_avx(auVar101,auVar288);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar227._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar227._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = local_1c0;
  auVar152 = vunpcklpd_avx(auVar65,auVar313);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar254._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar254._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar227,auVar254);
  auVar152 = vsubpd_avx(auVar151,auVar196);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       auVar152._0_8_ * dStack_240 +
       auVar151._0_8_ * dStack_228 +
       ((dVar59 * -2.0 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (local_1c0 + local_1c0) *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       * 4.0) * dStack_210 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * 2.0 +
       local_1c0 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       + dVar59 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[1]) * local_248 +
       (dVar59 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] +
        local_1c0 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [5] + (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] * 2.0) * local_230 +
       ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] * 2.0 +
       dVar59 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[7] +
       local_1c0 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       ) * local_218 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       (dStack_240 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + dStack_210 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              dStack_228 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * dVar59 +
       (dStack_228 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + dStack_210 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       dStack_240 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * -2.0 +
       (dStack_240 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + dStack_228 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              dStack_210 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * dStack_1c8 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] =
       (local_248 *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_218 *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_230 *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * local_248 +
       (local_230 *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_218 *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_248 *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * local_230 +
       (local_248 *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_230 *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_218 *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_218;
  auVar66._8_8_ = dStack_240;
  auVar66._0_8_ = local_248;
  auVar72._8_8_ = dStack_228;
  auVar72._0_8_ = local_230;
  auVar79._8_8_ = dStack_210;
  auVar79._0_8_ = local_218;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = local_248;
  auVar152 = vunpcklpd_avx(auVar66,auVar344);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar197._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar197._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = local_230;
  auVar152 = vunpcklpd_avx(auVar72,auVar289);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar228._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar228._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = local_218;
  auVar152 = vunpcklpd_avx(auVar79,auVar314);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar255._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar255._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar228,auVar255);
  auVar152 = vsubpd_avx(auVar151,auVar197);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] =
       auVar152._0_8_ * local_238 +
       auVar151._0_8_ * local_220 +
       ((local_230 * -2.0 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (local_218 + local_218) *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (local_248 + local_248) *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * local_208 +
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[4];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] =
       (local_238 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_208 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_220 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * local_238 +
       (local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_208 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_238 *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * local_220 +
       (local_238 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_220 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_208 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_208 +
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[4];
  auVar128._8_8_ = auVar183._8_8_;
  auVar128._0_8_ = auVar183._0_8_;
  auVar136._8_8_ = dVar58;
  auVar136._0_8_ = auVar183._8_8_;
  auVar144._8_8_ = 0xc000000000000000;
  auVar144._0_8_ = dVar2;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = auVar183._0_8_;
  auVar154 = vunpcklpd_avx(auVar128,auVar345);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar290._8_8_ = 0;
  auVar290._0_8_ = auVar183._8_8_;
  auVar155 = vunpcklpd_avx(auVar136,auVar290);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar315._8_8_ = 0;
  auVar315._0_8_ = dVar2;
  auVar156 = vunpcklpd_avx(auVar144,auVar315);
  auVar153 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar198._0_8_ =
       (auVar154._0_8_ + auVar154._0_8_) * auVar151._0_8_ +
       (auVar155._0_8_ + auVar155._0_8_) * auVar152._0_8_ +
       auVar153._0_8_ * (auVar156._0_8_ + auVar156._0_8_);
  auVar198._8_8_ =
       (auVar154._8_8_ + auVar154._8_8_) * auVar151._8_8_ +
       (auVar155._8_8_ + auVar155._8_8_) * auVar152._8_8_ +
       auVar153._8_8_ * (auVar156._8_8_ + auVar156._8_8_);
  auVar151 = vshufpd_avx(auVar198,auVar198,1);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar198._0_8_ * local_248 +
       auVar151._0_8_ * local_230 +
       ((auVar183._0_8_ + auVar183._0_8_) *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + (auVar183._8_8_ + auVar183._8_8_) *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              (dVar2 + dVar2) *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_218;
  auVar129._8_8_ = auVar183._8_8_;
  auVar129._0_8_ = auVar183._0_8_;
  auVar137._8_8_ = dVar58;
  auVar137._0_8_ = auVar183._8_8_;
  auVar145._8_8_ = 0xc000000000000000;
  auVar145._0_8_ = dVar2;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = auVar183._0_8_;
  auVar152 = vunpcklpd_avx(auVar129,auVar346);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar199._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar199._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = auVar183._8_8_;
  auVar152 = vunpcklpd_avx(auVar137,auVar291);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar229._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar229._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = dVar2;
  auVar152 = vunpcklpd_avx(auVar145,auVar316);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar256._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar256._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar229,auVar256);
  auVar152 = vsubpd_avx(auVar151,auVar199);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar152._0_8_ * local_238 +
       auVar151._0_8_ * local_220 +
       ((auVar183._8_8_ * -2.0 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (dVar2 + dVar2) *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (auVar183._0_8_ + auVar183._0_8_) *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * local_208 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [4];
  auVar67._8_8_ = dStack_240;
  auVar67._0_8_ = local_248;
  auVar73._8_8_ = dStack_228;
  auVar73._0_8_ = local_230;
  auVar80._8_8_ = dStack_210;
  auVar80._0_8_ = local_218;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = local_248;
  auVar152 = vunpcklpd_avx(auVar67,auVar347);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar200._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar200._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = local_230;
  auVar152 = vunpcklpd_avx(auVar73,auVar292);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar230._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar230._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = local_218;
  auVar152 = vunpcklpd_avx(auVar80,auVar317);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar257._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar257._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar230,auVar257);
  auVar152 = vsubpd_avx(auVar151,auVar200);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar152._0_8_ * auVar325._0_8_ +
       auVar151._0_8_ * 2.0 +
       ((local_230 * -2.0 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (local_218 + local_218) *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (local_248 + local_248) *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * dVar58 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [4];
  auVar135._8_8_ = auVar183._8_8_;
  auVar135._0_8_ = auVar325._0_8_;
  auVar143._8_8_ = dVar2;
  auVar143._0_8_ = 0x4000000000000000;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = auVar325._0_8_;
  auVar154 = vunpcklpd_avx(auVar135,auVar329);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar155 = vunpcklpd_avx(auVar143,ZEXT816(0x4000000000000000));
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  dVar182 = dVar58 + dVar58;
  auVar153 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar201._0_8_ =
       (auVar154._0_8_ + auVar154._0_8_) * auVar151._0_8_ +
       (auVar155._0_8_ + auVar155._0_8_) * auVar152._0_8_ + dVar182 * auVar153._0_8_;
  auVar201._8_8_ =
       (auVar154._8_8_ + auVar154._8_8_) * auVar151._8_8_ +
       (auVar155._8_8_ + auVar155._8_8_) * auVar152._8_8_ + dVar182 * auVar153._8_8_;
  auVar151 = vshufpd_avx(auVar201,auVar201,1);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar201._0_8_ * local_238 +
       auVar151._0_8_ * local_220 +
       ((auVar325._0_8_ + auVar325._0_8_) *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] * 4.0 +
              dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[8]) * local_208 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [4];
  auVar112._8_8_ = auVar183._8_8_;
  auVar112._0_8_ = auVar183._0_8_;
  auVar121._8_8_ = auVar325._0_8_;
  auVar121._0_8_ = 0x4000000000000000;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = local_1a8;
  auVar154 = vunpcklpd_avx(auVar64,auVar348);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar293._8_8_ = 0;
  auVar293._0_8_ = auVar183._0_8_;
  auVar155 = vunpcklpd_avx(auVar112,auVar293);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar156 = vunpcklpd_avx(auVar121,ZEXT816(0x4000000000000000));
  auVar153 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar202._0_8_ =
       (auVar154._0_8_ + auVar154._0_8_) * auVar151._0_8_ +
       (auVar155._0_8_ + auVar155._0_8_) * auVar152._0_8_ +
       auVar153._0_8_ * (auVar156._0_8_ + auVar156._0_8_);
  auVar202._8_8_ =
       (auVar154._8_8_ + auVar154._8_8_) * auVar151._8_8_ +
       (auVar155._8_8_ + auVar155._8_8_) * auVar152._8_8_ +
       auVar153._8_8_ * (auVar156._8_8_ + auVar156._8_8_);
  auVar151 = vshufpd_avx(auVar202,auVar202,1);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar202._0_8_ * local_248 +
       auVar151._0_8_ * local_230 +
       ((local_1a8 + local_1a8) *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + (auVar183._0_8_ + auVar183._0_8_) *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8] * 4.0) * local_218;
  auVar113._8_8_ = auVar183._8_8_;
  auVar113._0_8_ = auVar183._0_8_;
  auVar122._8_8_ = auVar325._0_8_;
  auVar122._0_8_ = 0x4000000000000000;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = local_1a8;
  auVar152 = vunpcklpd_avx(auVar64,auVar349);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar203._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar203._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = auVar183._0_8_;
  auVar152 = vunpcklpd_avx(auVar113,auVar294);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar231._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar231._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar152 = vunpcklpd_avx(auVar122,ZEXT816(0x4000000000000000));
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar258._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar258._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar231,auVar258);
  auVar152 = vsubpd_avx(auVar151,auVar203);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar152._0_8_ * local_238 +
       auVar151._0_8_ * local_220 +
       ((auVar183._0_8_ * -2.0 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8] * 4.0) -
       (local_1a8 + local_1a8) *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * local_208 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [4];
  auVar68._8_8_ = dStack_240;
  auVar68._0_8_ = local_248;
  auVar74._8_8_ = dStack_228;
  auVar74._0_8_ = local_230;
  auVar81._8_8_ = dStack_210;
  auVar81._0_8_ = local_218;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = local_248;
  auVar152 = vunpcklpd_avx(auVar68,auVar350);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar204._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar204._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = local_230;
  auVar152 = vunpcklpd_avx(auVar74,auVar295);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar232._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar232._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = local_218;
  auVar152 = vunpcklpd_avx(auVar81,auVar318);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar259._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar259._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar232,auVar259);
  auVar152 = vsubpd_avx(auVar151,auVar204);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar152._0_8_ * -2.0 +
       auVar151._0_8_ * dVar3 +
       ((local_230 * -2.0 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (local_218 + local_218) *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (local_248 + local_248) *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * auVar325._8_8_ +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [4];
  auVar111._8_8_ = auVar183._0_8_;
  auVar111._0_8_ = 0xc000000000000000;
  auVar120._8_8_ = 0x4000000000000000;
  auVar120._0_8_ = dVar3;
  auVar154 = vunpcklpd_avx(auVar111,ZEXT816(0xc000000000000000));
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar260._8_8_ = 0;
  auVar260._0_8_ = dVar3;
  auVar155 = vunpcklpd_avx(auVar120,auVar260);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  dVar182 = auVar325._8_8_ + auVar325._8_8_;
  auVar153 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar205._0_8_ =
       (auVar154._0_8_ + auVar154._0_8_) * auVar151._0_8_ +
       (auVar155._0_8_ + auVar155._0_8_) * auVar152._0_8_ + dVar182 * auVar153._0_8_;
  auVar205._8_8_ =
       (auVar154._8_8_ + auVar154._8_8_) * auVar151._8_8_ +
       (auVar155._8_8_ + auVar155._8_8_) * auVar152._8_8_ + dVar182 * auVar153._8_8_;
  auVar151 = vshufpd_avx(auVar205,auVar205,1);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar205._0_8_ * local_238 +
       auVar151._0_8_ * local_220 +
       ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] * -4.0 +
       (dVar3 + dVar3) *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       + dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8]) * local_208 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [4];
  auVar87._8_8_ = 0x4000000000000000;
  auVar87._0_8_ = dVar59;
  auVar96._8_8_ = dVar59;
  auVar96._0_8_ = 0xc000000000000000;
  auVar103._8_8_ = local_1c0;
  auVar103._0_8_ = dStack_1c8;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = dVar59;
  auVar154 = vunpcklpd_avx(auVar87,auVar351);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar155 = vunpcklpd_avx(auVar96,ZEXT816(0xc000000000000000));
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar319._8_8_ = 0;
  auVar319._0_8_ = dStack_1c8;
  auVar156 = vunpcklpd_avx(auVar103,auVar319);
  auVar153 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar206._0_8_ =
       (auVar154._0_8_ + auVar154._0_8_) * auVar151._0_8_ +
       (auVar155._0_8_ + auVar155._0_8_) * auVar152._0_8_ +
       auVar153._0_8_ * (auVar156._0_8_ + auVar156._0_8_);
  auVar206._8_8_ =
       (auVar154._8_8_ + auVar154._8_8_) * auVar151._8_8_ +
       (auVar155._8_8_ + auVar155._8_8_) * auVar152._8_8_ +
       auVar153._8_8_ * (auVar156._8_8_ + auVar156._8_8_);
  auVar151 = vshufpd_avx(auVar206,auVar206,1);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar206._0_8_ * local_248 +
       auVar151._0_8_ * local_230 +
       ((dVar59 + dVar59) *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] * -4.0 +
              (dStack_1c8 + dStack_1c8) *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_218;
  auVar88._8_8_ = 0x4000000000000000;
  auVar88._0_8_ = dVar59;
  auVar97._8_8_ = dVar59;
  auVar97._0_8_ = 0xc000000000000000;
  auVar104._8_8_ = local_1c0;
  auVar104._0_8_ = dStack_1c8;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = dVar59;
  auVar152 = vunpcklpd_avx(auVar88,auVar352);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar207._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar207._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar152 = vunpcklpd_avx(auVar97,ZEXT816(0xc000000000000000));
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar233._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar233._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = dStack_1c8;
  auVar152 = vunpcklpd_avx(auVar104,auVar320);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar261._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar261._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar233,auVar261);
  auVar152 = vsubpd_avx(auVar151,auVar207);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar152._0_8_ * local_238 +
       auVar151._0_8_ * local_220 +
       (((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] * 4.0 -
        (dStack_1c8 + dStack_1c8) *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [8]) - (dVar59 + dVar59) *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * local_208 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [4];
  auVar69._8_8_ = dStack_240;
  auVar69._0_8_ = local_248;
  auVar75._8_8_ = dStack_228;
  auVar75._0_8_ = local_230;
  auVar82._8_8_ = dStack_210;
  auVar82._0_8_ = local_218;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = local_248;
  auVar152 = vunpcklpd_avx(auVar69,auVar353);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar208._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar208._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = local_230;
  auVar152 = vunpcklpd_avx(auVar75,auVar296);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar234._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar234._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = local_218;
  auVar152 = vunpcklpd_avx(auVar82,auVar321);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar262._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar262._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar234,auVar262);
  auVar152 = vsubpd_avx(auVar151,auVar208);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar152._0_8_ * dVar4 +
       auVar151._0_8_ * dStack_1d0 +
       ((local_230 * -2.0 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (local_218 + local_218) *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (local_248 + local_248) *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * dStack_1b8 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [4];
  auVar95._8_8_ = 0xc000000000000000;
  auVar95._0_8_ = dVar4;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = dVar4;
  auVar154 = vunpcklpd_avx(auVar95,auVar330);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar263._8_8_ = 0;
  auVar263._0_8_ = dStack_1d0;
  auVar155 = vunpcklpd_avx(auVar63,auVar263);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  dVar182 = dStack_1b8 + dStack_1b8;
  auVar153 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar209._0_8_ =
       (auVar154._0_8_ + auVar154._0_8_) * auVar151._0_8_ +
       (auVar155._0_8_ + auVar155._0_8_) * auVar152._0_8_ + dVar182 * auVar153._0_8_;
  auVar209._8_8_ =
       (auVar154._8_8_ + auVar154._8_8_) * auVar151._8_8_ +
       (auVar155._8_8_ + auVar155._8_8_) * auVar152._8_8_ + dVar182 * auVar153._8_8_;
  auVar151 = vshufpd_avx(auVar209,auVar209,1);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       auVar209._0_8_ * local_238 +
       auVar151._0_8_ * local_220 +
       ((dVar4 + dVar4) *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + (dStack_1d0 + dStack_1d0) *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[8]) * local_208 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [4];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] =
       (local_248 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_218 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_230 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * dStack_240 +
       (local_230 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_218 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_248 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * dStack_228 +
       (local_248 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_230 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_218 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * dStack_210;
  dVar182 = -local_218;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] =
       ((dVar182 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_230 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_248 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * local_248 +
       ((dVar182 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        local_230 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - local_248 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * local_230 +
       ((dVar182 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        local_230 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - local_248 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * local_218 +
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[7];
  dVar182 = -local_208;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] =
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_238 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * dStack_240 +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - local_238 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * dStack_228 +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - local_238 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * dStack_210 +
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[7];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] =
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * local_248 +
       (local_220 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_238 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * local_230 +
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_218 +
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[7];
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       (auVar183._0_8_ *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] +
              auVar183._8_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * dStack_240 +
       (auVar183._8_8_ *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5] +
       auVar183._0_8_ *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * dStack_228 +
       (auVar183._0_8_ *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + auVar183._8_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) * dStack_210;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       (local_248 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_218 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_230 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * auVar183._8_8_ +
       (local_230 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_218 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_248 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * dVar58 +
       (local_248 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_230 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_218 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * -2.0 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  auVar130._8_8_ = auVar183._8_8_;
  auVar130._0_8_ = auVar183._0_8_;
  auVar138._8_8_ = dVar58;
  auVar138._0_8_ = auVar183._8_8_;
  auVar146._8_8_ = 0xc000000000000000;
  auVar146._0_8_ = dVar2;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = auVar183._0_8_;
  auVar152 = vunpcklpd_avx(auVar130,auVar354);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar210._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar210._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = auVar183._8_8_;
  auVar152 = vunpcklpd_avx(auVar138,auVar297);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar235._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar235._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = dVar2;
  auVar152 = vunpcklpd_avx(auVar146,auVar322);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar264._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar264._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar235,auVar264);
  auVar152 = vsubpd_avx(auVar151,auVar210);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       auVar152._0_8_ * local_248 +
       auVar151._0_8_ * local_230 +
       ((auVar183._8_8_ * -2.0 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (dVar2 + dVar2) *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (auVar183._0_8_ + auVar183._0_8_) *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * local_218 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  dVar182 = -dVar58;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1] * 2.0) -
       auVar325._0_8_ *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       ) * dStack_240 +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] * 2.0) -
       auVar325._0_8_ *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * dStack_228 +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7] * 2.0) -
       auVar325._0_8_ *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * dStack_210 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  dVar182 = -local_208;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_238 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * auVar183._8_8_ +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - local_238 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * dVar58 +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - local_238 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * -2.0 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       (auVar325._0_8_ *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + dVar58 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[2] +
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] * 2.0) * local_248 +
       ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] * 2.0 +
        dVar58 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5] +
       auVar325._0_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * local_230 +
       (auVar325._0_8_ *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] * 2.0 +
              dVar58 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[8]) * local_218 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * auVar183._0_8_ +
       (local_220 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_238 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * auVar183._8_8_ +
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * dVar2 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       (local_1a8 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] * 2.0 +
              auVar183._0_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * dStack_240 +
       (auVar183._0_8_ *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] * 2.0 +
       local_1a8 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * dStack_228 +
       (local_1a8 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + auVar183._0_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8] * 2.0) * dStack_210;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       (local_248 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_218 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_230 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * dStack_1a0 +
       (local_230 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_218 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_248 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * auVar183._8_8_ +
       (local_248 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_230 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_218 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * auVar325._0_8_ +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  auVar114._8_8_ = auVar183._8_8_;
  auVar114._0_8_ = auVar183._0_8_;
  auVar123._8_8_ = auVar325._0_8_;
  auVar123._0_8_ = 0x4000000000000000;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = local_1a8;
  auVar152 = vunpcklpd_avx(auVar64,auVar355);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar211._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar211._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = auVar183._0_8_;
  auVar152 = vunpcklpd_avx(auVar114,auVar298);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar236._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar236._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar152 = vunpcklpd_avx(auVar123,ZEXT816(0x4000000000000000));
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar265._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar265._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar236,auVar265);
  auVar152 = vsubpd_avx(auVar151,auVar211);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       auVar152._0_8_ * local_248 +
       auVar151._0_8_ * local_230 +
       ((auVar183._0_8_ * -2.0 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8] * 4.0) -
       (local_1a8 + local_1a8) *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * local_218 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  dVar182 = -auVar325._8_8_;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        dVar3 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[1]) -
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       * -2.0) * dStack_240 +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        dVar3 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[4]) -
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       * -2.0) * dStack_228 +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        dVar3 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[7]) -
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       * -2.0) * dStack_210 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  dVar182 = -local_208;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_238 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * dStack_1a0 +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - local_238 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * auVar183._8_8_ +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - local_238 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * auVar325._0_8_ +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * -2.0 +
       auVar325._8_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       + dVar3 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1]) * local_248 +
       (dVar3 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[4] +
        auVar325._8_8_ *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [5] + (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] * -2.0) * local_230 +
       ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] * -2.0 +
       dVar3 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
       auVar325._8_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       ) * local_218 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * local_1a8 +
       (local_220 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_238 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * auVar183._0_8_ +
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * 2.0 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       (dVar59 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] +
       dStack_1c8 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       + (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1] * -2.0) * dStack_240 +
       ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] * -2.0 +
        dStack_1c8 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [5] + dVar59 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) * dStack_228 +
       (dVar59 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[6] +
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       * -2.0 + dStack_1c8 *
                (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[8]) * dStack_210;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       (local_248 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_218 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] +
              local_230 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1]) * 2.0 +
       (local_230 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + local_218 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
       local_248 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * dVar59 +
       (local_248 *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_230 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_218 *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_1c0 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  auVar89._8_8_ = 0x4000000000000000;
  auVar89._0_8_ = dVar59;
  auVar98._8_8_ = dVar59;
  auVar98._0_8_ = 0xc000000000000000;
  auVar105._8_8_ = local_1c0;
  auVar105._0_8_ = dStack_1c8;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = dVar59;
  auVar152 = vunpcklpd_avx(auVar89,auVar356);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar212._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar212._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar152 = vunpcklpd_avx(auVar98,ZEXT816(0xc000000000000000));
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar237._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar237._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = dStack_1c8;
  auVar152 = vunpcklpd_avx(auVar105,auVar323);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar266._0_8_ = auVar151._0_8_ * (auVar152._0_8_ + auVar152._0_8_);
  auVar266._8_8_ = auVar151._8_8_ * (auVar152._8_8_ + auVar152._8_8_);
  auVar151 = vsubpd_avx(auVar237,auVar266);
  auVar152 = vsubpd_avx(auVar151,auVar212);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       auVar152._0_8_ * local_248 +
       auVar151._0_8_ * local_230 +
       (((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] * 4.0 -
        (dStack_1c8 + dStack_1c8) *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [8]) - (dVar59 + dVar59) *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * local_218 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  dVar182 = -dStack_1b8;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        dStack_1d0 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - dVar4 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0]) * dStack_240 +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        dStack_1d0 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - dVar4 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) * dStack_228 +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        dStack_1d0 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - dVar4 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) * dStack_210 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  dVar182 = -local_208;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_238 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * 2.0 +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - local_238 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * dVar59 +
       ((dVar182 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        local_220 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - local_238 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * local_1c0 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       (dVar4 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0] +
       dStack_1d0 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
       + dStack_1b8 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [2]) * local_248 +
       (dVar4 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3] +
       dStack_1b8 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
       + dStack_1d0 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [4]) * local_230 +
       (dVar4 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6] +
       dStack_1d0 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       + dStack_1b8 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [8]) * local_218 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * dVar59 +
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
              local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) * -2.0 +
       (local_238 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_220 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_208 *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * dStack_1c8 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] =
       (dStack_240 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + dStack_228 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              dStack_210 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * dStack_240 +
       (dStack_240 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + dStack_210 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
              dStack_228 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) * dStack_228 +
       (dStack_240 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + dStack_228 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              dStack_210 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * dStack_210;
  auVar63._8_8_ = dStack_240;
  auVar63._0_8_ = local_248;
  auVar76._8_8_ = dStack_228;
  auVar76._0_8_ = local_230;
  auVar83._8_8_ = dStack_210;
  auVar83._0_8_ = local_218;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = local_248;
  auVar152 = vunpcklpd_avx(auVar63,auVar331);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar170._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar170._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = local_230;
  auVar152 = vunpcklpd_avx(auVar76,auVar267);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar213._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar213._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = local_218;
  auVar152 = vunpcklpd_avx(auVar83,auVar299);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar238._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar238._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar213,auVar238);
  auVar152 = vsubpd_avx(auVar151,auVar170);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] =
       auVar152._0_8_ * dStack_240 +
       auVar151._0_8_ * dStack_228 +
       ((local_230 * -2.0 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (local_218 + local_218) *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (local_248 + local_248) *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * dStack_210 +
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[8];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] =
       (local_248 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_230 *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_218 *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * local_248 +
       (local_248 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_218 *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
              local_230 *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) * local_230 +
       (local_248 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_230 *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_218 *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_218 +
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[8];
  auVar134._8_8_ = auVar325._0_8_;
  auVar134._0_8_ = auVar183._8_8_;
  auVar142._8_8_ = 0x4000000000000000;
  auVar142._0_8_ = dVar58;
  auVar150._8_8_ = dVar58;
  auVar150._0_8_ = 0xc000000000000000;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = auVar183._8_8_;
  auVar154 = vunpcklpd_avx(auVar134,auVar332);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar268._8_8_ = 0;
  auVar268._0_8_ = dVar58;
  auVar155 = vunpcklpd_avx(auVar142,auVar268);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar156 = vunpcklpd_avx(auVar150,ZEXT816(0xc000000000000000));
  auVar153 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar171._0_8_ =
       (auVar154._0_8_ + auVar154._0_8_) * auVar151._0_8_ +
       (auVar155._0_8_ + auVar155._0_8_) * auVar152._0_8_ +
       (auVar156._0_8_ + auVar156._0_8_) * auVar153._0_8_;
  auVar171._8_8_ =
       (auVar154._8_8_ + auVar154._8_8_) * auVar151._8_8_ +
       (auVar155._8_8_ + auVar155._8_8_) * auVar152._8_8_ +
       (auVar156._8_8_ + auVar156._8_8_) * auVar153._8_8_;
  auVar151 = vshufpd_avx(auVar171,auVar171,1);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar171._0_8_ * dStack_240 +
       auVar151._0_8_ * dStack_228 +
       ((auVar183._8_8_ + auVar183._8_8_) *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + (dVar58 + dVar58) *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8] * -4.0) * dStack_210;
  auVar131._8_8_ = auVar183._8_8_;
  auVar131._0_8_ = auVar183._0_8_;
  auVar139._8_8_ = dVar58;
  auVar139._0_8_ = auVar183._8_8_;
  auVar147._8_8_ = 0xc000000000000000;
  auVar147._0_8_ = dVar2;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = auVar183._0_8_;
  auVar152 = vunpcklpd_avx(auVar131,auVar333);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar172._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar172._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = auVar183._8_8_;
  auVar152 = vunpcklpd_avx(auVar139,auVar269);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar214._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar214._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = dVar2;
  auVar152 = vunpcklpd_avx(auVar147,auVar300);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar239._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar239._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar214,auVar239);
  auVar152 = vsubpd_avx(auVar151,auVar172);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar152._0_8_ * dStack_240 +
       auVar151._0_8_ * dStack_228 +
       ((auVar183._8_8_ * -2.0 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (dVar2 + dVar2) *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (auVar183._0_8_ + auVar183._0_8_) *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * dStack_210 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [8];
  auVar70._8_8_ = dStack_240;
  auVar70._0_8_ = local_248;
  auVar77._8_8_ = dStack_228;
  auVar77._0_8_ = local_230;
  auVar84._8_8_ = dStack_210;
  auVar84._0_8_ = local_218;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = local_248;
  auVar152 = vunpcklpd_avx(auVar70,auVar334);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar173._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar173._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = local_230;
  auVar152 = vunpcklpd_avx(auVar77,auVar270);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar215._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar215._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = local_218;
  auVar152 = vunpcklpd_avx(auVar84,auVar301);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar240._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar240._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar215,auVar240);
  auVar152 = vsubpd_avx(auVar151,auVar173);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar152._0_8_ * auVar183._8_8_ +
       auVar151._0_8_ * dVar58 +
       ((local_230 * -2.0 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (local_218 + local_218) *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (local_248 + local_248) *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * -2.0 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [8];
  auVar132._8_8_ = auVar183._8_8_;
  auVar132._0_8_ = auVar183._0_8_;
  auVar140._8_8_ = dVar58;
  auVar140._0_8_ = auVar183._8_8_;
  auVar148._8_8_ = 0xc000000000000000;
  auVar148._0_8_ = dVar2;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = auVar183._0_8_;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = auVar183._8_8_;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = dVar2;
  auVar154 = vunpcklpd_avx(auVar132,auVar271);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar155 = vunpcklpd_avx(auVar140,auVar302);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar156 = vunpcklpd_avx(auVar148,auVar324);
  auVar153 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar174._0_8_ =
       auVar151._0_8_ * (auVar154._0_8_ + auVar154._0_8_) +
       auVar152._0_8_ * (auVar155._0_8_ + auVar155._0_8_) +
       auVar153._0_8_ * (auVar156._0_8_ + auVar156._0_8_);
  auVar174._8_8_ =
       auVar151._8_8_ * (auVar154._8_8_ + auVar154._8_8_) +
       auVar152._8_8_ * (auVar155._8_8_ + auVar155._8_8_) +
       auVar153._8_8_ * (auVar156._8_8_ + auVar156._8_8_);
  auVar151 = vshufpd_avx(auVar174,auVar174,1);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar174._0_8_ * local_248 +
       auVar151._0_8_ * local_230 +
       ((auVar183._0_8_ + auVar183._0_8_) *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + (auVar183._8_8_ + auVar183._8_8_) *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              (dVar2 + dVar2) *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_218 +
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [8];
  auVar109._8_8_ = 0xc000000000000000;
  auVar109._0_8_ = dStack_1a0;
  auVar118._8_8_ = dVar3;
  auVar118._0_8_ = auVar183._8_8_;
  auVar127._8_8_ = auVar325._8_8_;
  auVar127._0_8_ = auVar325._0_8_;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = dStack_1a0;
  auVar154 = vunpcklpd_avx(auVar109,auVar335);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar272._8_8_ = 0;
  auVar272._0_8_ = auVar183._8_8_;
  auVar155 = vunpcklpd_avx(auVar118,auVar272);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar303._8_8_ = 0;
  auVar303._0_8_ = auVar325._0_8_;
  auVar156 = vunpcklpd_avx(auVar127,auVar303);
  auVar153 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar175._0_8_ =
       (auVar154._0_8_ + auVar154._0_8_) * auVar151._0_8_ +
       (auVar155._0_8_ + auVar155._0_8_) * auVar152._0_8_ +
       (auVar156._0_8_ + auVar156._0_8_) * auVar153._0_8_;
  auVar175._8_8_ =
       (auVar154._8_8_ + auVar154._8_8_) * auVar151._8_8_ +
       (auVar155._8_8_ + auVar155._8_8_) * auVar152._8_8_ +
       (auVar156._8_8_ + auVar156._8_8_) * auVar153._8_8_;
  auVar151 = vshufpd_avx(auVar175,auVar175,1);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar175._0_8_ * dStack_240 +
       auVar151._0_8_ * dStack_228 +
       ((dStack_1a0 + dStack_1a0) *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + (auVar183._8_8_ + auVar183._8_8_) *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              (auVar325._0_8_ + auVar325._0_8_) *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * dStack_210;
  auVar115._8_8_ = auVar183._8_8_;
  auVar115._0_8_ = auVar183._0_8_;
  auVar124._8_8_ = auVar325._0_8_;
  auVar124._0_8_ = 0x4000000000000000;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = local_1a8;
  auVar152 = vunpcklpd_avx(auVar64,auVar336);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar176._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar176._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = auVar183._0_8_;
  auVar152 = vunpcklpd_avx(auVar115,auVar273);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar216._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar216._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar152 = vunpcklpd_avx(auVar124,ZEXT816(0x4000000000000000));
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar241._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar241._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar216,auVar241);
  auVar152 = vsubpd_avx(auVar151,auVar176);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar152._0_8_ * dStack_240 +
       auVar151._0_8_ * dStack_228 +
       ((auVar183._0_8_ * -2.0 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8] * 4.0) -
       (local_1a8 + local_1a8) *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * dStack_210 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [8];
  auVar71._8_8_ = dStack_240;
  auVar71._0_8_ = local_248;
  auVar78._8_8_ = dStack_228;
  auVar78._0_8_ = local_230;
  auVar85._8_8_ = dStack_210;
  auVar85._0_8_ = local_218;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = local_248;
  auVar152 = vunpcklpd_avx(auVar71,auVar337);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar177._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar177._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = local_230;
  auVar152 = vunpcklpd_avx(auVar78,auVar274);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar217._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar217._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = local_218;
  auVar152 = vunpcklpd_avx(auVar85,auVar304);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar242._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar242._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar217,auVar242);
  auVar152 = vsubpd_avx(auVar151,auVar177);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar152._0_8_ * dStack_1a0 +
       auVar151._0_8_ * auVar183._8_8_ +
       ((local_230 * -2.0 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (local_218 + local_218) *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (local_248 + local_248) *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * auVar325._0_8_ +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [8];
  auVar116._8_8_ = auVar183._8_8_;
  auVar116._0_8_ = auVar183._0_8_;
  auVar125._8_8_ = auVar325._0_8_;
  auVar125._0_8_ = 0x4000000000000000;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = local_1a8;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = auVar183._0_8_;
  auVar154 = vunpcklpd_avx(auVar64,auVar275);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar155 = vunpcklpd_avx(auVar116,auVar305);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar156 = vunpcklpd_avx(auVar125,ZEXT816(0x4000000000000000));
  auVar153 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar178._0_8_ =
       auVar151._0_8_ * (auVar154._0_8_ + auVar154._0_8_) +
       auVar152._0_8_ * (auVar155._0_8_ + auVar155._0_8_) +
       auVar153._0_8_ * (auVar156._0_8_ + auVar156._0_8_);
  auVar178._8_8_ =
       auVar151._8_8_ * (auVar154._8_8_ + auVar154._8_8_) +
       auVar152._8_8_ * (auVar155._8_8_ + auVar155._8_8_) +
       auVar153._8_8_ * (auVar156._8_8_ + auVar156._8_8_);
  auVar151 = vshufpd_avx(auVar178,auVar178,1);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar178._0_8_ * local_248 +
       auVar151._0_8_ * local_230 +
       ((local_1a8 + local_1a8) *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + (auVar183._0_8_ + auVar183._0_8_) *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8] * 4.0) * local_218 +
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [8];
  auVar93._8_8_ = dVar4;
  auVar93._0_8_ = 0x4000000000000000;
  auVar102._8_8_ = dStack_1d0;
  auVar102._0_8_ = dVar59;
  auVar154 = vunpcklpd_avx(auVar93,ZEXT816(0x4000000000000000));
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar276._8_8_ = 0;
  auVar276._0_8_ = dVar59;
  auVar155 = vunpcklpd_avx(auVar102,auVar276);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar306._8_8_ = 0;
  auVar306._0_8_ = local_1c0;
  auVar156 = vunpcklpd_avx(auVar65,auVar306);
  auVar153 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar179._0_8_ =
       (auVar154._0_8_ + auVar154._0_8_) * auVar151._0_8_ +
       (auVar155._0_8_ + auVar155._0_8_) * auVar152._0_8_ +
       (auVar156._0_8_ + auVar156._0_8_) * auVar153._0_8_;
  auVar179._8_8_ =
       (auVar154._8_8_ + auVar154._8_8_) * auVar151._8_8_ +
       (auVar155._8_8_ + auVar155._8_8_) * auVar152._8_8_ +
       (auVar156._8_8_ + auVar156._8_8_) * auVar153._8_8_;
  auVar151 = vshufpd_avx(auVar179,auVar179,1);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar179._0_8_ * dStack_240 +
       auVar151._0_8_ * dStack_228 +
       ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] * 4.0 +
       (dVar59 + dVar59) *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       + (local_1c0 + local_1c0) *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [8]) * dStack_210;
  auVar90._8_8_ = 0x4000000000000000;
  auVar90._0_8_ = dVar59;
  auVar99._8_8_ = dVar59;
  auVar99._0_8_ = 0xc000000000000000;
  auVar106._8_8_ = local_1c0;
  auVar106._0_8_ = dStack_1c8;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = dVar59;
  auVar152 = vunpcklpd_avx(auVar90,auVar338);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar180._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar180._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar152 = vunpcklpd_avx(auVar99,ZEXT816(0xc000000000000000));
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar218._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar218._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = dStack_1c8;
  auVar152 = vunpcklpd_avx(auVar106,auVar307);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar243._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar243._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar218,auVar243);
  auVar152 = vsubpd_avx(auVar151,auVar180);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar152._0_8_ * dStack_240 +
       auVar151._0_8_ * dStack_228 +
       (((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] * 4.0 -
        (dStack_1c8 + dStack_1c8) *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [8]) - (dVar59 + dVar59) *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) * dStack_210 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [8];
  auVar64._8_8_ = dStack_240;
  auVar64._0_8_ = local_248;
  auVar65._8_8_ = dStack_228;
  auVar65._0_8_ = local_230;
  auVar86._8_8_ = dStack_210;
  auVar86._0_8_ = local_218;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = local_248;
  auVar152 = vunpcklpd_avx(auVar64,auVar339);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar181._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar181._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = local_230;
  auVar152 = vunpcklpd_avx(auVar65,auVar277);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar166._0_8_ = auVar152._0_8_ * -2.0 * auVar151._0_8_;
  auVar166._8_8_ = auVar152._8_8_ * -2.0 * auVar151._8_8_;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = local_218;
  auVar152 = vunpcklpd_avx(auVar86,auVar219);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar244._0_8_ = (auVar152._0_8_ + auVar152._0_8_) * auVar151._0_8_;
  auVar244._8_8_ = (auVar152._8_8_ + auVar152._8_8_) * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar166,auVar244);
  auVar152 = vsubpd_avx(auVar151,auVar181);
  auVar151 = vshufpd_avx(auVar152,auVar152,1);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar152._0_8_ * 2.0 +
       auVar151._0_8_ * dVar59 +
       ((local_230 * -2.0 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] - (local_218 + local_218) *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) -
       (local_248 + local_248) *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * local_1c0 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [8];
  auVar91._8_8_ = 0x4000000000000000;
  auVar91._0_8_ = dVar59;
  auVar100._8_8_ = dVar59;
  auVar100._0_8_ = 0xc000000000000000;
  auVar107._8_8_ = local_1c0;
  auVar107._0_8_ = dStack_1c8;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = dVar59;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = dStack_1c8;
  auVar154 = vunpcklpd_avx(auVar91,auVar220);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array,
                         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[3]);
  auVar155 = vunpcklpd_avx(auVar100,ZEXT816(0xc000000000000000));
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 1),
                         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]);
  auVar156 = vunpcklpd_avx(auVar107,auVar278);
  auVar153 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 2),
                         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5]);
  auVar161._0_8_ =
       (auVar154._0_8_ + auVar154._0_8_) * auVar151._0_8_ +
       (auVar155._0_8_ + auVar155._0_8_) * auVar152._0_8_ +
       (auVar156._0_8_ + auVar156._0_8_) * auVar153._0_8_;
  auVar161._8_8_ =
       (auVar154._8_8_ + auVar154._8_8_) * auVar151._8_8_ +
       (auVar155._8_8_ + auVar155._8_8_) * auVar152._8_8_ +
       (auVar156._8_8_ + auVar156._8_8_) * auVar153._8_8_;
  auVar151 = vshufpd_avx(auVar161,auVar161,1);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       auVar161._0_8_ * local_248 +
       auVar151._0_8_ * local_230 +
       ((dVar59 + dVar59) *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] * -4.0 +
              (dStack_1c8 + dStack_1c8) *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) * local_218 +
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [8];
  dVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[6];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[3];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = dVar2;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[7];
  dVar2 = (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[6];
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  dVar2 = (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[6];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  dVar2 = (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[6];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar2;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d
opengv::relative_pose::modules::eigensolver::composeMwithJacobians(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const cayley_t & cayley,
    Eigen::Matrix3d & M_jac1,
    Eigen::Matrix3d & M_jac2,
    Eigen::Matrix3d & M_jac3 )
{
  rotation_t R = math::cayley2rot_reduced(cayley);
  rotation_t R_jac1;
  rotation_t R_jac2;
  rotation_t R_jac3;

  R_jac1(0,0) = 2*cayley[0];
  R_jac1(0,1) = 2*cayley[1];
  R_jac1(0,2) = 2*cayley[2];
  R_jac1(1,0) = 2*cayley[1];
  R_jac1(1,1) = -2*cayley[0];
  R_jac1(1,2) = -2;
  R_jac1(2,0) = 2*cayley[2];
  R_jac1(2,1) = 2;
  R_jac1(2,2) = -2*cayley[0];
  R_jac2(0,0) = -2*cayley[1];
  R_jac2(0,1) = 2*cayley[0];
  R_jac2(0,2) = 2;
  R_jac2(1,0) = 2*cayley[0];
  R_jac2(1,1) = 2*cayley[1];
  R_jac2(1,2) = 2*cayley[2];
  R_jac2(2,0) = -2;
  R_jac2(2,1) = 2*cayley[2];
  R_jac2(2,2) = -2*cayley[1];
  R_jac3(0,0) = -2*cayley[2];
  R_jac3(0,1) = -2;
  R_jac3(0,2) = 2*cayley[0];
  R_jac3(1,0) = 2;
  R_jac3(1,1) = -2*cayley[2];
  R_jac3(1,2) = 2*cayley[1];
  R_jac3(2,0) = 2*cayley[0];
  R_jac3(2,1) = 2*cayley[1];
  R_jac3(2,2) = 2*cayley[2];

  //Fill the matrix M using the precomputed summation terms. Plus Jacobian.
  Eigen::Matrix3d M;
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  M(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  M(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  M(0,0) += temp;
  temp = 2.0*R_jac1.row(2)*yyF*R.row(2).transpose();
  M_jac1(0,0)  = temp;
  temp = -2.0*R_jac1.row(2)*yzF*R.row(1).transpose();
  M_jac1(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac1.row(1).transpose();
  M_jac1(0,0) += temp;
  temp = 2.0*R_jac1.row(1)*zzF*R.row(1).transpose();
  M_jac1(0,0) += temp;
  temp = 2.0*R_jac2.row(2)*yyF*R.row(2).transpose();
  M_jac2(0,0)  = temp;
  temp = -2.0*R_jac2.row(2)*yzF*R.row(1).transpose();
  M_jac2(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac2.row(1).transpose();
  M_jac2(0,0) += temp;
  temp = 2.0*R_jac2.row(1)*zzF*R.row(1).transpose();
  M_jac2(0,0) += temp;
  temp = 2.0*R_jac3.row(2)*yyF*R.row(2).transpose();
  M_jac3(0,0)  = temp;
  temp = -2.0*R_jac3.row(2)*yzF*R.row(1).transpose();
  M_jac3(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac3.row(1).transpose();
  M_jac3(0,0) += temp;
  temp = 2.0*R_jac3.row(1)*zzF*R.row(1).transpose();
  M_jac3(0,0) += temp;

  temp =      R.row(2)*yzF*R.row(0).transpose();
  M(0,1)  = temp;
  temp = -1.0*R.row(2)*xyF*R.row(2).transpose();
  M(0,1) += temp;
  temp = -1.0*R.row(1)*zzF*R.row(0).transpose();
  M(0,1) += temp;
  temp =      R.row(1)*zxF*R.row(2).transpose();
  M(0,1) += temp;
  temp = R_jac1.row(2)*yzF*R.row(0).transpose();
  M_jac1(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac1.row(0).transpose();
  M_jac1(0,1) += temp;
  temp = -2.0*R_jac1.row(2)*xyF*R.row(2).transpose();
  M_jac1(0,1) += temp;
  temp = -R_jac1.row(1)*zzF*R.row(0).transpose();
  M_jac1(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac1.row(0).transpose();
  M_jac1(0,1) += temp;
  temp = R_jac1.row(1)*zxF*R.row(2).transpose();
  M_jac1(0,1) += temp;
  temp = R.row(1)*zxF*R_jac1.row(2).transpose();
  M_jac1(0,1) += temp;
  temp = R_jac2.row(2)*yzF*R.row(0).transpose();
  M_jac2(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac2.row(0).transpose();
  M_jac2(0,1) += temp;
  temp = -2.0*R_jac2.row(2)*xyF*R.row(2).transpose();
  M_jac2(0,1) += temp;
  temp = -R_jac2.row(1)*zzF*R.row(0).transpose();
  M_jac2(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac2.row(0).transpose();
  M_jac2(0,1) += temp;
  temp = R_jac2.row(1)*zxF*R.row(2).transpose();
  M_jac2(0,1) += temp;
  temp = R.row(1)*zxF*R_jac2.row(2).transpose();
  M_jac2(0,1) += temp;
  temp = R_jac3.row(2)*yzF*R.row(0).transpose();
  M_jac3(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac3.row(0).transpose();
  M_jac3(0,1) += temp;
  temp = -2.0*R_jac3.row(2)*xyF*R.row(2).transpose();
  M_jac3(0,1) += temp;
  temp = -R_jac3.row(1)*zzF*R.row(0).transpose();
  M_jac3(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac3.row(0).transpose();
  M_jac3(0,1) += temp;
  temp = R_jac3.row(1)*zxF*R.row(2).transpose();
  M_jac3(0,1) += temp;
  temp = R.row(1)*zxF*R_jac3.row(2).transpose();
  M_jac3(0,1) += temp;

  temp =      R.row(2)*xyF*R.row(1).transpose();
  M(0,2)  = temp;
  temp = -1.0*R.row(2)*yyF*R.row(0).transpose();
  M(0,2) += temp;
  temp = -1.0*R.row(1)*zxF*R.row(1).transpose();
  M(0,2) += temp;
  temp =      R.row(1)*yzF*R.row(0).transpose();
  M(0,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(1).transpose();
  M_jac1(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac1.row(1).transpose();
  M_jac1(0,2) += temp;
  temp = -R_jac1.row(2)*yyF*R.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac1.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = -2.0*R_jac1.row(1)*zxF*R.row(1).transpose();
  M_jac1(0,2) += temp;
  temp = R_jac1.row(1)*yzF*R.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = R.row(1)*yzF*R_jac1.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(1).transpose();
  M_jac2(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac2.row(1).transpose();
  M_jac2(0,2) += temp;
  temp = -R_jac2.row(2)*yyF*R.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac2.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = -2.0*R_jac2.row(1)*zxF*R.row(1).transpose();
  M_jac2(0,2) += temp;
  temp = R_jac2.row(1)*yzF*R.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = R.row(1)*yzF*R_jac2.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(1).transpose();
  M_jac3(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac3.row(1).transpose();
  M_jac3(0,2) += temp;
  temp = -R_jac3.row(2)*yyF*R.row(0).transpose();
  M_jac3(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac3.row(0).transpose();
  M_jac3(0,2) += temp;
  temp = -2.0*R_jac3.row(1)*zxF*R.row(1).transpose();
  M_jac3(0,2) += temp;
  temp = R_jac3.row(1)*yzF*R.row(0).transpose();
  M_jac3(0,2) += temp;
  temp = R.row(1)*yzF*R_jac3.row(0).transpose();
  M_jac3(0,2) += temp;

  temp =      R.row(0)*zzF*R.row(0).transpose();
  M(1,1)  = temp;
  temp = -2.0*R.row(0)*zxF*R.row(2).transpose();
  M(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  M(1,1) += temp;
  temp = 2.0*R_jac1.row(0)*zzF*R.row(0).transpose();
  M_jac1(1,1)  = temp;
  temp = -2.0*R_jac1.row(0)*zxF*R.row(2).transpose();
  M_jac1(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac1.row(2).transpose();
  M_jac1(1,1) += temp;
  temp = 2.0*R_jac1.row(2)*xxF*R.row(2).transpose();
  M_jac1(1,1) += temp;
  temp = 2.0*R_jac2.row(0)*zzF*R.row(0).transpose();
  M_jac2(1,1)  = temp;
  temp = -2.0*R_jac2.row(0)*zxF*R.row(2).transpose();
  M_jac2(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac2.row(2).transpose();
  M_jac2(1,1) += temp;
  temp = 2.0*R_jac2.row(2)*xxF*R.row(2).transpose();
  M_jac2(1,1) += temp;
  temp = 2.0*R_jac3.row(0)*zzF*R.row(0).transpose();
  M_jac3(1,1)  = temp;
  temp = -2.0*R_jac3.row(0)*zxF*R.row(2).transpose();
  M_jac3(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac3.row(2).transpose();
  M_jac3(1,1) += temp;
  temp = 2.0*R_jac3.row(2)*xxF*R.row(2).transpose();
  M_jac3(1,1) += temp;

  temp =      R.row(0)*zxF*R.row(1).transpose();
  M(1,2)  = temp;
  temp = -1.0*R.row(0)*yzF*R.row(0).transpose();
  M(1,2) += temp;
  temp = -1.0*R.row(2)*xxF*R.row(1).transpose();
  M(1,2) += temp;
  temp =      R.row(2)*xyF*R.row(0).transpose();
  M(1,2) += temp;
  temp = R_jac1.row(0)*zxF*R.row(1).transpose();
  M_jac1(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac1.row(1).transpose();
  M_jac1(1,2) += temp;
  temp = -2.0*R_jac1.row(0)*yzF*R.row(0).transpose();
  M_jac1(1,2) += temp;
  temp = -R_jac1.row(2)*xxF*R.row(1).transpose();
  M_jac1(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac1.row(1).transpose();
  M_jac1(1,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(0).transpose();
  M_jac1(1,2) += temp;
  temp = R.row(2)*xyF*R_jac1.row(0).transpose();
  M_jac1(1,2) += temp;
  temp = R_jac2.row(0)*zxF*R.row(1).transpose();
  M_jac2(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac2.row(1).transpose();
  M_jac2(1,2) += temp;
  temp = -2.0*R_jac2.row(0)*yzF*R.row(0).transpose();
  M_jac2(1,2) += temp;
  temp = -R_jac2.row(2)*xxF*R.row(1).transpose();
  M_jac2(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac2.row(1).transpose();
  M_jac2(1,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(0).transpose();
  M_jac2(1,2) += temp;
  temp = R.row(2)*xyF*R_jac2.row(0).transpose();
  M_jac2(1,2) += temp;
  temp = R_jac3.row(0)*zxF*R.row(1).transpose();
  M_jac3(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac3.row(1).transpose();
  M_jac3(1,2) += temp;
  temp = -2.0*R_jac3.row(0)*yzF*R.row(0).transpose();
  M_jac3(1,2) += temp;
  temp = -R_jac3.row(2)*xxF*R.row(1).transpose();
  M_jac3(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac3.row(1).transpose();
  M_jac3(1,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(0).transpose();
  M_jac3(1,2) += temp;
  temp = R.row(2)*xyF*R_jac3.row(0).transpose();
  M_jac3(1,2) += temp;

  temp =      R.row(1)*xxF*R.row(1).transpose();
  M(2,2)  = temp;
  temp = -2.0*R.row(0)*xyF*R.row(1).transpose();
  M(2,2) += temp;
  temp =      R.row(0)*yyF*R.row(0).transpose();
  M(2,2) += temp;
  temp = 2.0*R_jac1.row(1)*xxF*R.row(1).transpose();
  M_jac1(2,2)  = temp;
  temp = -2.0*R_jac1.row(0)*xyF*R.row(1).transpose();
  M_jac1(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac1.row(1).transpose();
  M_jac1(2,2) += temp;
  temp = 2.0*R_jac1.row(0)*yyF*R.row(0).transpose();
  M_jac1(2,2) += temp;
  temp = 2.0*R_jac2.row(1)*xxF*R.row(1).transpose();
  M_jac2(2,2)  = temp;
  temp = -2.0*R_jac2.row(0)*xyF*R.row(1).transpose();
  M_jac2(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac2.row(1).transpose();
  M_jac2(2,2) += temp;
  temp = 2.0*R_jac2.row(0)*yyF*R.row(0).transpose();
  M_jac2(2,2) += temp;
  temp = 2.0*R_jac3.row(1)*xxF*R.row(1).transpose();
  M_jac3(2,2)  = temp;
  temp = -2.0*R_jac3.row(0)*xyF*R.row(1).transpose();
  M_jac3(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac3.row(1).transpose();
  M_jac3(2,2) += temp;
  temp = 2.0*R_jac3.row(0)*yyF*R.row(0).transpose();
  M_jac3(2,2) += temp;

  M(1,0) = M(0,1);
  M(2,0) = M(0,2);
  M(2,1) = M(1,2);
  M_jac1(1,0) = M_jac1(0,1);
  M_jac1(2,0) = M_jac1(0,2);
  M_jac1(2,1) = M_jac1(1,2);
  M_jac2(1,0) = M_jac2(0,1);
  M_jac2(2,0) = M_jac2(0,2);
  M_jac2(2,1) = M_jac2(1,2);
  M_jac3(1,0) = M_jac3(0,1);
  M_jac3(2,0) = M_jac3(0,2);
  M_jac3(2,1) = M_jac3(1,2);

  return M;
}